

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O0

int ConnectgpControl(GPCONTROL *pgpControl,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char local_248 [8];
  char streamingstatustmp [256];
  char *pcStack_140;
  int BytesReceived;
  char *body;
  char *title;
  char *ptr;
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  GPCONTROL *pgpControl_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  title = (char *)0x0;
  body = (char *)0x0;
  pcStack_140 = (char *)0x0;
  streamingstatustmp[0xfc] = '\0';
  streamingstatustmp[0xfd] = '\0';
  streamingstatustmp[0xfe] = '\0';
  streamingstatustmp[0xff] = '\0';
  memset(pgpControl->szCfgFilePath,0,0x100);
  sprintf(pgpControl->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&ptr,0,0x100);
    memset(pgpControl->szDevPath,0,0x100);
    sprintf(pgpControl->szDevPath,"udp://10.5.5.9:8554");
    pgpControl->threadperiod = 100;
    pgpControl->bSaveRawData = 0;
    pgpControl->bDisableHTTPPersistent = 0;
    pgpControl->bDisableStreamingSettings = 0;
    pgpControl->bDisableStatusCheck = 0;
    memset(pgpControl->streamingstarthttpreq,0,0x100);
    sprintf(pgpControl->streamingstarthttpreq,
            "http://10.5.5.9/gp/gpControl/execute?p1=gpStream&a1=proto_v2&c1=restart");
    memset(pgpControl->streamingbitratehttpreq,0,0x100);
    sprintf(pgpControl->streamingbitratehttpreq,"http://10.5.5.9/gp/gpControl/setting/62/2000000");
    memset(pgpControl->streamingresolutionhttpreq,0,0x100);
    sprintf(pgpControl->streamingresolutionhttpreq,"http://10.5.5.9/gp/gpControl/setting/64/7");
    memset(pgpControl->statushttpreq,0,0x100);
    sprintf(pgpControl->statushttpreq,"http://10.5.5.9/gp/gpControl/status");
    pgpControl->streamingstatusid = 0x20;
    memset(pgpControl->keepalivemsg,0,0x100);
    sprintf(pgpControl->keepalivemsg,"_GPHD_:0:0:2:0.000000");
    pgpControl->keepaliveperiod = 2000;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->bDisableHTTPPersistent);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->bDisableStreamingSettings);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->bDisableStatusCheck);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->streamingstarthttpreq);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->streamingbitratehttpreq);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->streamingresolutionhttpreq);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->statushttpreq);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->streamingstatusid);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%255s",pgpControl->keepalivemsg);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr,"%d",&pgpControl->keepaliveperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pgpControl->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pgpControl->threadperiod = 100;
  }
  iVar1 = OpenRS232Port(&pgpControl->RS232Port,pgpControl->szDevPath);
  if (iVar1 == 0) {
    iVar1 = inittcpcli(&pgpControl->tcpsock,(pgpControl->RS232Port).address,"80");
    if (iVar1 == 0) {
      iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingstarthttpreq);
      if (iVar1 == 0) {
        if ((pgpControl->bDisableStatusCheck == 0) &&
           (iVar1 = recvsimplehtml(pgpControl->tcpsock,&body,&stack0xfffffffffffffec0,0x100,
                                   (int *)(streamingstatustmp + 0xfc)), iVar1 != 0)) {
          printf("Unable to connect to a gpControl.\n");
          releasetcpcli(pgpControl->tcpsock);
          CloseRS232Port(&pgpControl->RS232Port);
          pgpControl_local._4_4_ = 1;
        }
        else if ((pgpControl->bDisableHTTPPersistent == 0) ||
                (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 == 0)) {
          if (pgpControl->bDisableStreamingSettings == 0) {
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = inittcpcli(&pgpControl->tcpsock,(pgpControl->RS232Port).address,"80"),
               iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingbitratehttpreq);
            if (iVar1 != 0) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableStatusCheck == 0) &&
               (iVar1 = recvsimplehtml(pgpControl->tcpsock,&body,&stack0xfffffffffffffec0,0x100,
                                       (int *)(streamingstatustmp + 0xfc)), iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = inittcpcli(&pgpControl->tcpsock,(pgpControl->RS232Port).address,"80"),
               iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->streamingresolutionhttpreq)
            ;
            if (iVar1 != 0) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableStatusCheck == 0) &&
               (iVar1 = recvsimplehtml(pgpControl->tcpsock,&body,&stack0xfffffffffffffec0,0x100,
                                       (int *)(streamingstatustmp + 0xfc)), iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
          }
          mSleep(0xfa);
          if (pgpControl->bDisableStatusCheck == 0) {
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = inittcpcli(&pgpControl->tcpsock,(pgpControl->RS232Port).address,"80"),
               iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            iVar1 = sendsimplehttpgetreq(pgpControl->tcpsock,pgpControl->statushttpreq);
            if (iVar1 != 0) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            iVar1 = recvsimplehtml(pgpControl->tcpsock,&body,&stack0xfffffffffffffec0,0x100,
                                   (int *)(streamingstatustmp + 0xfc));
            if (iVar1 != 0) {
              printf("Unable to connect to a gpControl.\n");
              releasetcpcli(pgpControl->tcpsock);
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            if ((pgpControl->bDisableHTTPPersistent != 0) &&
               (iVar1 = releasetcpcli(pgpControl->tcpsock), iVar1 != 0)) {
              printf("Unable to connect to a gpControl.\n");
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            sprintf(local_248,"\"%d\":",(ulong)(uint)pgpControl->streamingstatusid);
            pcVar2 = strstr(pcStack_140,local_248);
            title = pcVar2;
            if ((pcVar2 == (char *)0x0) || (sVar3 = strlen(local_248), pcVar2[sVar3] != '1')) {
              printf("Unable to connect to a gpControl.\n");
              free(body);
              free(pcStack_140);
              if (pgpControl->bDisableHTTPPersistent == 0) {
                releasetcpcli(pgpControl->tcpsock);
              }
              CloseRS232Port(&pgpControl->RS232Port);
              return 1;
            }
            free(body);
            free(pcStack_140);
          }
          printf("gpControl connected.\n");
          pgpControl_local._4_4_ = 0;
        }
        else {
          printf("Unable to connect to a gpControl.\n");
          CloseRS232Port(&pgpControl->RS232Port);
          pgpControl_local._4_4_ = 1;
        }
      }
      else {
        printf("Unable to connect to a gpControl.\n");
        releasetcpcli(pgpControl->tcpsock);
        CloseRS232Port(&pgpControl->RS232Port);
        pgpControl_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a gpControl.\n");
      CloseRS232Port(&pgpControl->RS232Port);
      pgpControl_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a gpControl.\n");
    pgpControl_local._4_4_ = 1;
  }
  return pgpControl_local._4_4_;
}

Assistant:

inline int ConnectgpControl(GPCONTROL* pgpControl, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* ptr = NULL;
	char* title = NULL;
	char* body = NULL;
	int BytesReceived = 0;
	char streamingstatustmp[256];

	memset(pgpControl->szCfgFilePath, 0, sizeof(pgpControl->szCfgFilePath));
	sprintf(pgpControl->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pgpControl->szDevPath, 0, sizeof(pgpControl->szDevPath));
		sprintf(pgpControl->szDevPath, "udp://10.5.5.9:8554");
		//pgpControl->BaudRate = 9600;
		//pgpControl->timeout = 1000;
		pgpControl->threadperiod = 100;
		pgpControl->bSaveRawData = 0; // Not a parameter at the moment...
		pgpControl->bDisableHTTPPersistent = 0;
		pgpControl->bDisableStreamingSettings = 0;
		pgpControl->bDisableStatusCheck = 0;
		memset(pgpControl->streamingstarthttpreq, 0, sizeof(pgpControl->streamingstarthttpreq));
		sprintf(pgpControl->streamingstarthttpreq, "http://10.5.5.9/gp/gpControl/execute?p1=gpStream&a1=proto_v2&c1=restart");
		memset(pgpControl->streamingbitratehttpreq, 0, sizeof(pgpControl->streamingbitratehttpreq));
		sprintf(pgpControl->streamingbitratehttpreq, "http://10.5.5.9/gp/gpControl/setting/62/2000000");
		memset(pgpControl->streamingresolutionhttpreq, 0, sizeof(pgpControl->streamingresolutionhttpreq));
		sprintf(pgpControl->streamingresolutionhttpreq, "http://10.5.5.9/gp/gpControl/setting/64/7");
		memset(pgpControl->statushttpreq, 0, sizeof(pgpControl->statushttpreq));
		sprintf(pgpControl->statushttpreq, "http://10.5.5.9/gp/gpControl/status");
		pgpControl->streamingstatusid = 32;
		memset(pgpControl->keepalivemsg, 0, sizeof(pgpControl->keepalivemsg));
		sprintf(pgpControl->keepalivemsg, "_GPHD_:0:0:2:0.000000");
		pgpControl->keepaliveperiod = 2000;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->szDevPath) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->BaudRate) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->threadperiod) != 1) printf("Invalid configuration file.\n");
			//if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			//if (sscanf(line, "%d", &pgpControl->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableHTTPPersistent) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableStreamingSettings) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->bDisableStatusCheck) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingstarthttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingbitratehttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->streamingresolutionhttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->statushttpreq) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->streamingstatusid) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pgpControl->keepalivemsg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pgpControl->keepaliveperiod) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pgpControl->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pgpControl->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pgpControl->pfSaveFile = NULL;

	//pgpControl->LastVal = 0;

	// UDP connection.
	if (OpenRS232Port(&pgpControl->RS232Port, pgpControl->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		return EXIT_FAILURE;
	}

	//if (SetOptionsRS232Port(&pgpControl->RS232Port, pgpControl->BaudRate, NOPARITY, FALSE, 8, 
	//	ONESTOPBIT, (UINT)pgpControl->timeout) != EXIT_SUCCESS)
	//{
	//	printf("Unable to connect to a gpControl.\n");
	//	CloseRS232Port(&pgpControl->RS232Port);
	//	return EXIT_FAILURE;
	//}

	// Web connection.
	if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		CloseRS232Port(&pgpControl->RS232Port);
		return EXIT_FAILURE;
	}

	if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingstarthttpreq) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a gpControl.\n");
		releasetcpcli(pgpControl->tcpsock);
		CloseRS232Port(&pgpControl->RS232Port);
		return EXIT_FAILURE;
	}
	if (!pgpControl->bDisableStatusCheck)
	{
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}
	if (pgpControl->bDisableHTTPPersistent)
	{
		if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
	}

	if (!pgpControl->bDisableStreamingSettings)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingbitratehttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (!pgpControl->bDisableStatusCheck)
		{
			if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				releasetcpcli(pgpControl->tcpsock);
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->streamingresolutionhttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (!pgpControl->bDisableStatusCheck)
		{
			if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				releasetcpcli(pgpControl->tcpsock);
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
	}

	mSleep(250);

	if (!pgpControl->bDisableStatusCheck)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->statushttpreq) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Unable to connect to a gpControl.\n");
			releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Unable to connect to a gpControl.\n");
				CloseRS232Port(&pgpControl->RS232Port);
				return EXIT_FAILURE;
			}
		}
		sprintf(streamingstatustmp, "\"%d\":", pgpControl->streamingstatusid);
		ptr = strstr(body, streamingstatustmp);
		if ((ptr == NULL)||(ptr[strlen(streamingstatustmp)] != '1'))
		{
			printf("Unable to connect to a gpControl.\n");
			free(title);
			free(body);
			if (!pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			CloseRS232Port(&pgpControl->RS232Port);
			return EXIT_FAILURE;
		}
		free(title);
		free(body);
	}

	printf("gpControl connected.\n");

	return EXIT_SUCCESS;
}